

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZEigenAnalysis.cpp
# Opt level: O3

TPZEigenSolver<std::complex<double>_> * __thiscall
TPZEigenAnalysis::EigenSolver<std::complex<double>>(TPZEigenAnalysis *this)

{
  TPZRestoreClassBase *in_RAX;
  TPZEigenSolver<std::complex<double>_> *pTVar1;
  TPZEigenSolver<std::complex<double>_> *extraout_RAX;
  TPZSolver *pTVar2;
  
  pTVar2 = (this->super_TPZAnalysis).fSolver;
  pTVar1 = (TPZEigenSolver<std::complex<double>_> *)
           __dynamic_cast(pTVar2,&TPZSolver::typeinfo,
                          &TPZEigenSolver<std::complex<double>>::typeinfo,0);
  if (pTVar1 != (TPZEigenSolver<std::complex<double>_> *)0x0) {
    return pTVar1;
  }
  EigenSolver<std::complex<double>>();
  (pTVar2->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR_Restore_0196a948;
  TPZSavable::Register(in_RAX);
  return extraout_RAX;
}

Assistant:

TPZEigenSolver<TVar> &TPZEigenAnalysis::EigenSolver()
{
    const auto tmp = dynamic_cast<TPZEigenSolver<TVar>*>(fSolver);
    if(fSolver && !tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible Solver type! Aborting\n";
        DebugStop();
    }
    return *tmp;
}